

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ExpressionLhs<bool>::endExpression(ExpressionLhs<bool> *this)

{
  bool result;
  ResultBuilder *pRVar1;
  bool in_DL;
  string local_38;
  
  pRVar1 = this->m_rb;
  result = this->m_lhs;
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)result,in_DL);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  ResultBuilder::endExpression(pRVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }